

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::UninterpretedOption_NamePart::SerializeWithCachedSizesToArray
          (UninterpretedOption_NamePart *this,uint8 *target)

{
  bool bVar1;
  string *str;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  uint uVar3;
  uint8 *puVar4;
  
  uVar3 = this->_has_bits_[0];
  if ((uVar3 & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_part_->_M_dataplus)._M_p,(int)this->name_part_->_M_string_length,
               SERIALIZE);
    str = this->name_part_;
    *target = '\n';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray((uint32)str->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(str,puVar4);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 2) != 0) {
    bVar1 = this->is_extension_;
    *target = '\x10';
    target = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,target + 1);
  }
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar4 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
    return puVar4;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* UninterpretedOption_NamePart::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // required string name_part = 1;
  if (has_name_part()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name_part().data(), this->name_part().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name_part(), target);
  }

  // required bool is_extension = 2;
  if (has_is_extension()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->is_extension(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}